

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_dbmi_16(void)

{
  short sVar1;
  uint uVar2;
  uint *puVar3;
  
  if (((byte)m68ki_cpu.n_flag & 0x80) == 0) {
    sVar1 = (short)m68ki_cpu.dar[m68ki_cpu.ir & 7];
    *(short *)(m68ki_cpu.dar + (m68ki_cpu.ir & 7)) = sVar1 + -1;
    if (sVar1 == 0) {
      puVar3 = &m68ki_cpu.cyc_dbcc_f_exp;
      m68ki_cpu.pc = m68ki_cpu.pc + 2;
    }
    else {
      uVar2 = m68ki_read_imm_16();
      m68ki_cpu.pc = ((int)(short)uVar2 + m68ki_cpu.pc) - 2;
      puVar3 = &m68ki_cpu.cyc_dbcc_f_noexp;
    }
    m68ki_remaining_cycles = m68ki_remaining_cycles - *puVar3;
  }
  else {
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
  }
  return;
}

Assistant:

static void m68k_op_dbmi_16(void)
{
	if(COND_NOT_MI())
	{
		uint* r_dst = &DY;
		uint res = MASK_OUT_ABOVE_16(*r_dst - 1);

		*r_dst = MASK_OUT_BELOW_16(*r_dst) | res;
		if(res != 0xffff)
		{
			uint offset = OPER_I_16();
			REG_PC -= 2;
			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			m68ki_branch_16(offset);
			USE_CYCLES(CYC_DBCC_F_NOEXP);
			return;
		}
		REG_PC += 2;
		USE_CYCLES(CYC_DBCC_F_EXP);
		return;
	}
	REG_PC += 2;
}